

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O2

value * __thiscall
mjs::object::property::get(value *__return_storage_ptr__,property *this,object *self)

{
  gc_heap *heap;
  bool bVar1;
  gc_heap_ptr_untyped *p;
  undefined8 *puVar2;
  object_ptr a;
  value g;
  value v;
  gc_heap_ptr_untyped local_e0;
  undefined1 local_d0 [24];
  wchar_t *local_b8;
  vector<mjs::value,_std::allocator<mjs::value>_> local_98;
  value local_78;
  value local_50;
  
  heap = self->heap_;
  value_representation::get_value(&local_50,&this->value_,heap);
  bVar1 = is_accessor(this);
  if (bVar1) {
    if (local_50.type_ != object) {
      __assert_fail("v.type() == value_type::object",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/object.cpp"
                    ,0xe2,"value mjs::object::property::get(const object &) const");
    }
    p = &value::object_value(&local_50)->super_gc_heap_ptr_untyped;
    gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_e0,p);
    puVar2 = (undefined8 *)gc_heap_ptr_untyped::get(&local_e0);
    local_d0._16_8_ = (slot *)0x3;
    local_b8 = L"get";
    (**(code **)*puVar2)(&local_78,puVar2);
    puVar2 = (undefined8 *)gc_heap_ptr_untyped::get(&local_e0);
    local_98.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0xa;
    local_98.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x1837c4;
    (**(code **)*puVar2)(local_d0 + 0x10,puVar2);
    bVar1 = value::boolean_value((value *)(local_d0 + 0x10));
    if (bVar1) {
      bVar1 = is_primitive_object(self);
    }
    else {
      bVar1 = false;
    }
    value::~value((value *)(local_d0 + 0x10));
    if (local_78.type_ == undefined) {
      value::value(__return_storage_ptr__,&local_78);
    }
    else {
      if (bVar1 == false) {
        gc_heap::unsafe_track<mjs::object>((gc_heap *)local_d0,(object *)heap);
        value::value((value *)(local_d0 + 0x10),(object_ptr *)local_d0);
      }
      else {
        (*self->_vptr_object[4])(local_d0 + 0x10,self);
      }
      local_98.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_98.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_98.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      call_function(__return_storage_ptr__,&local_78,(value *)(local_d0 + 0x10),&local_98);
      std::vector<mjs::value,_std::allocator<mjs::value>_>::~vector(&local_98);
      value::~value((value *)(local_d0 + 0x10));
      if (bVar1 == false) {
        gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_d0);
      }
    }
    value::~value(&local_78);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_e0);
  }
  else {
    value::value(__return_storage_ptr__,&local_50);
  }
  value::~value(&local_50);
  return __return_storage_ptr__;
}

Assistant:

value object::property::get(const object& self) const {
    auto& h = self.heap();
    auto v = raw_get(h);
    if (is_accessor()) {
        assert(v.type() == value_type::object);
        auto a = v.object_value();
        auto g = a->get(L"get");
        const bool strict = a->get(L"__strict__").boolean_value() && is_primitive_object(self);
        return g.type() != value_type::undefined ? call_function(g, strict ? self.internal_value() : value{h.unsafe_track(self)}, {}) : g;
    }
    return v;
}